

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O1

char __thiscall Jupiter::IRC::Client::Channel::getUserPrefix(Channel *this,string_view in_nickname)

{
  char cVar1;
  string_view in_nickname_00;
  shared_ptr<Jupiter::IRC::Client::Channel::User> user;
  _Alloc_hider local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  in_nickname_00._M_str = (char *)in_nickname._M_len;
  in_nickname_00._M_len = (size_t)this;
  getUser((Channel *)&stack0xffffffffffffffe0,in_nickname_00);
  if ((User *)local_20._M_p == (User *)0x0) {
    cVar1 = '\0';
  }
  else {
    cVar1 = getUserPrefix(this,(User *)local_20._M_p);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return cVar1;
}

Assistant:

char Jupiter::IRC::Client::Channel::getUserPrefix(std::string_view in_nickname) const {
	auto user = getUser(in_nickname);

	if (user != nullptr)
		return this->getUserPrefix(*user);

	return 0;
}